

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O0

size_t WebRtcSpl_MinIndexW16(int16_t *vector,size_t length)

{
  short local_2a;
  size_t sStack_28;
  int16_t minimum;
  size_t index;
  size_t i;
  size_t length_local;
  int16_t *vector_local;
  
  sStack_28 = 0;
  local_2a = 0x7fff;
  if (length != 0) {
    for (index = 0; index < length; index = index + 1) {
      if (vector[index] < local_2a) {
        local_2a = vector[index];
        sStack_28 = index;
      }
    }
    return sStack_28;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,0xc5,"size_t WebRtcSpl_MinIndexW16(const int16_t *, size_t)");
}

Assistant:

size_t WebRtcSpl_MinIndexW16(const int16_t* vector, size_t length) {
  size_t i = 0, index = 0;
  int16_t minimum = WEBRTC_SPL_WORD16_MAX;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] < minimum) {
      minimum = vector[i];
      index = i;
    }
  }

  return index;
}